

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

bool winmd::reader::database::is_database(string_view *path)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  image_dos_header *piVar4;
  image_nt_headers32 *piVar5;
  image_section_header *piVar6;
  image_nt_headers32plus *piVar7;
  image_section_header *piVar8;
  image_cor20_header *piVar9;
  uint *puVar10;
  uint32_t rva;
  image_section_header *last;
  bool bVar11;
  file_view file;
  allocator<char> local_59;
  file_view local_58;
  string local_40;
  
  file_view::file_view(&local_58,path);
  if (((int)local_58.super_byte_view.m_last - (int)local_58.super_byte_view.m_first & 0xffffffc0U)
      != 0) {
    piVar4 = byte_view::as<winmd::impl::image_dos_header>(&local_58.super_byte_view,0);
    if (piVar4->e_signature == 0x5a4d) {
      uVar3 = piVar4->e_lfanew;
      if ((long)(int)uVar3 + 0xf8U <=
          (ulong)(uint)((int)local_58.super_byte_view.m_last - (int)local_58.super_byte_view.m_first
                       )) {
        piVar5 = byte_view::as<winmd::impl::image_nt_headers32>(&local_58.super_byte_view,uVar3);
        uVar1 = (piVar5->FileHeader).NumberOfSections;
        if (0xff9b < (ushort)(uVar1 - 0x65)) {
          uVar2 = (piVar5->OptionalHeader).Magic;
          if (uVar2 == 0x20b) {
            piVar7 = byte_view::as<winmd::impl::image_nt_headers32plus>
                               (&local_58.super_byte_view,uVar3);
            rva = (piVar7->OptionalHeader).DataDirectory[0xe].VirtualAddress;
            piVar6 = byte_view::as<winmd::impl::image_section_header>
                               (&local_58.super_byte_view,uVar3 + 0x108);
          }
          else {
            if (uVar2 != 0x10b) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40,"Invalid optional header magic value",&local_59);
              impl::throw_invalid(&local_40);
            }
            rva = (piVar5->OptionalHeader).DataDirectory[0xe].VirtualAddress;
            piVar6 = byte_view::as<winmd::impl::image_section_header>
                               (&local_58.super_byte_view,(uint32_t)((long)(int)uVar3 + 0xf8U));
          }
          last = piVar6 + uVar1;
          piVar8 = section_from_rva(piVar6,last,rva);
          if (piVar8 != last) {
            piVar9 = byte_view::as<winmd::impl::image_cor20_header>
                               (&local_58.super_byte_view,
                                (rva - piVar8->VirtualAddress) + piVar8->PointerToRawData);
            if (piVar9->cb == 0x48) {
              uVar3 = (piVar9->MetaData).VirtualAddress;
              piVar6 = section_from_rva(piVar6,last,uVar3);
              if (piVar6 != last) {
                puVar10 = byte_view::as<unsigned_int>
                                    (&local_58.super_byte_view,
                                     (uVar3 - piVar6->VirtualAddress) + piVar6->PointerToRawData);
                bVar11 = *puVar10 == 0x424a5342;
                goto LAB_00148e56;
              }
            }
          }
        }
      }
    }
  }
  bVar11 = false;
LAB_00148e56:
  file_view::~file_view(&local_58);
  return bVar11;
}

Assistant:

static bool is_database(std::string_view const& path)
        {
            file_view file{ path };

            if (file.size() < sizeof(impl::image_dos_header))
            {
                return false;
            }

            auto dos = file.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                return false;
            }

            if (file.size() < (dos.e_lfanew + sizeof(impl::image_nt_headers32)))
            {
                return false;
            }

            auto pe = file.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                return false;
            }
            
            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = file.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                return false;
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = file.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                return false;
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                return false;
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (file.as<uint32_t>(offset) != 0x424a5342)
            {
                return false;
            }

            return true;
        }